

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsIntMapCopy(FmsIntType src_type,void *src,FmsIntType dst_type,void *dst,void *map,FmsInt size)

{
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  uint in_EDI;
  long in_R8;
  ulong in_R9;
  FmsInt idx_63;
  FmsInt idx_62;
  FmsInt idx_61;
  FmsInt idx_60;
  FmsInt idx_59;
  FmsInt idx_58;
  FmsInt idx_57;
  FmsInt idx_56;
  FmsInt idx_55;
  FmsInt idx_54;
  FmsInt idx_53;
  FmsInt idx_52;
  FmsInt idx_51;
  FmsInt idx_50;
  FmsInt idx_49;
  FmsInt idx_48;
  FmsInt idx_47;
  FmsInt idx_46;
  FmsInt idx_45;
  FmsInt idx_44;
  FmsInt idx_43;
  FmsInt idx_42;
  FmsInt idx_41;
  FmsInt idx_40;
  FmsInt idx_39;
  FmsInt idx_38;
  FmsInt idx_37;
  FmsInt idx_36;
  FmsInt idx_35;
  FmsInt idx_34;
  FmsInt idx_33;
  FmsInt idx_32;
  FmsInt idx_31;
  FmsInt idx_30;
  FmsInt idx_29;
  FmsInt idx_28;
  FmsInt idx_27;
  FmsInt idx_26;
  FmsInt idx_25;
  FmsInt idx_24;
  FmsInt idx_23;
  FmsInt idx_22;
  FmsInt idx_21;
  FmsInt idx_20;
  FmsInt idx_19;
  FmsInt idx_18;
  FmsInt idx_17;
  FmsInt idx_16;
  FmsInt idx_15;
  FmsInt idx_14;
  FmsInt idx_13;
  FmsInt idx_12;
  FmsInt idx_11;
  FmsInt idx_10;
  FmsInt idx_9;
  FmsInt idx_8;
  FmsInt idx_7;
  FmsInt idx_6;
  FmsInt idx_5;
  FmsInt idx_4;
  FmsInt idx_3;
  FmsInt idx_2;
  FmsInt idx_1;
  FmsInt idx;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  int local_4;
  
  if ((in_EDI < 8) && (in_EDX < 8)) {
    switch(in_EDX) {
    case 0:
      switch(in_EDI) {
      case 0:
        for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
          *(undefined1 *)(in_RCX + local_38) = *(undefined1 *)(in_R8 + *(char *)(in_RSI + local_38))
          ;
        }
        break;
      case 1:
        for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
          *(undefined1 *)(in_RCX + local_40) =
               *(undefined1 *)(in_R8 + *(short *)(in_RSI + local_40 * 2));
        }
        break;
      case 2:
        for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
          *(undefined1 *)(in_RCX + local_48) =
               *(undefined1 *)(in_R8 + *(int *)(in_RSI + local_48 * 4));
        }
        break;
      case 3:
        for (local_50 = 0; local_50 < in_R9; local_50 = local_50 + 1) {
          *(undefined1 *)(in_RCX + local_50) =
               *(undefined1 *)(in_R8 + *(long *)(in_RSI + local_50 * 8));
        }
        break;
      case 4:
        for (local_58 = 0; local_58 < in_R9; local_58 = local_58 + 1) {
          *(undefined1 *)(in_RCX + local_58) =
               *(undefined1 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_58));
        }
        break;
      case 5:
        for (local_60 = 0; local_60 < in_R9; local_60 = local_60 + 1) {
          *(undefined1 *)(in_RCX + local_60) =
               *(undefined1 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_60 * 2));
        }
        break;
      case 6:
        for (local_68 = 0; local_68 < in_R9; local_68 = local_68 + 1) {
          *(undefined1 *)(in_RCX + local_68) =
               *(undefined1 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_68 * 4));
        }
        break;
      case 7:
        for (local_70 = 0; local_70 < in_R9; local_70 = local_70 + 1) {
          *(undefined1 *)(in_RCX + local_70) =
               *(undefined1 *)(in_R8 + *(long *)(in_RSI + local_70 * 8));
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 1:
      switch(in_EDI) {
      case 0:
        for (local_78 = 0; local_78 < in_R9; local_78 = local_78 + 1) {
          *(undefined2 *)(in_RCX + local_78 * 2) =
               *(undefined2 *)(in_R8 + (long)*(char *)(in_RSI + local_78) * 2);
        }
        break;
      case 1:
        for (local_80 = 0; local_80 < in_R9; local_80 = local_80 + 1) {
          *(undefined2 *)(in_RCX + local_80 * 2) =
               *(undefined2 *)(in_R8 + (long)*(short *)(in_RSI + local_80 * 2) * 2);
        }
        break;
      case 2:
        for (local_88 = 0; local_88 < in_R9; local_88 = local_88 + 1) {
          *(undefined2 *)(in_RCX + local_88 * 2) =
               *(undefined2 *)(in_R8 + (long)*(int *)(in_RSI + local_88 * 4) * 2);
        }
        break;
      case 3:
        for (local_90 = 0; local_90 < in_R9; local_90 = local_90 + 1) {
          *(undefined2 *)(in_RCX + local_90 * 2) =
               *(undefined2 *)(in_R8 + *(long *)(in_RSI + local_90 * 8) * 2);
        }
        break;
      case 4:
        for (local_98 = 0; local_98 < in_R9; local_98 = local_98 + 1) {
          *(undefined2 *)(in_RCX + local_98 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_98) * 2);
        }
        break;
      case 5:
        for (local_a0 = 0; local_a0 < in_R9; local_a0 = local_a0 + 1) {
          *(undefined2 *)(in_RCX + local_a0 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_a0 * 2) * 2);
        }
        break;
      case 6:
        for (local_a8 = 0; local_a8 < in_R9; local_a8 = local_a8 + 1) {
          *(undefined2 *)(in_RCX + local_a8 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_a8 * 4) * 2);
        }
        break;
      case 7:
        for (local_b0 = 0; local_b0 < in_R9; local_b0 = local_b0 + 1) {
          *(undefined2 *)(in_RCX + local_b0 * 2) =
               *(undefined2 *)(in_R8 + *(long *)(in_RSI + local_b0 * 8) * 2);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 2:
      switch(in_EDI) {
      case 0:
        for (local_b8 = 0; local_b8 < in_R9; local_b8 = local_b8 + 1) {
          *(undefined4 *)(in_RCX + local_b8 * 4) =
               *(undefined4 *)(in_R8 + (long)*(char *)(in_RSI + local_b8) * 4);
        }
        break;
      case 1:
        for (local_c0 = 0; local_c0 < in_R9; local_c0 = local_c0 + 1) {
          *(undefined4 *)(in_RCX + local_c0 * 4) =
               *(undefined4 *)(in_R8 + (long)*(short *)(in_RSI + local_c0 * 2) * 4);
        }
        break;
      case 2:
        for (local_c8 = 0; local_c8 < in_R9; local_c8 = local_c8 + 1) {
          *(undefined4 *)(in_RCX + local_c8 * 4) =
               *(undefined4 *)(in_R8 + (long)*(int *)(in_RSI + local_c8 * 4) * 4);
        }
        break;
      case 3:
        for (local_d0 = 0; local_d0 < in_R9; local_d0 = local_d0 + 1) {
          *(undefined4 *)(in_RCX + local_d0 * 4) =
               *(undefined4 *)(in_R8 + *(long *)(in_RSI + local_d0 * 8) * 4);
        }
        break;
      case 4:
        for (local_d8 = 0; local_d8 < in_R9; local_d8 = local_d8 + 1) {
          *(undefined4 *)(in_RCX + local_d8 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_d8) * 4);
        }
        break;
      case 5:
        for (local_e0 = 0; local_e0 < in_R9; local_e0 = local_e0 + 1) {
          *(undefined4 *)(in_RCX + local_e0 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_e0 * 2) * 4);
        }
        break;
      case 6:
        for (local_e8 = 0; local_e8 < in_R9; local_e8 = local_e8 + 1) {
          *(undefined4 *)(in_RCX + local_e8 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_e8 * 4) * 4);
        }
        break;
      case 7:
        for (local_f0 = 0; local_f0 < in_R9; local_f0 = local_f0 + 1) {
          *(undefined4 *)(in_RCX + local_f0 * 4) =
               *(undefined4 *)(in_R8 + *(long *)(in_RSI + local_f0 * 8) * 4);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 3:
      switch(in_EDI) {
      case 0:
        for (local_f8 = 0; local_f8 < in_R9; local_f8 = local_f8 + 1) {
          *(undefined8 *)(in_RCX + local_f8 * 8) =
               *(undefined8 *)(in_R8 + (long)*(char *)(in_RSI + local_f8) * 8);
        }
        break;
      case 1:
        for (local_100 = 0; local_100 < in_R9; local_100 = local_100 + 1) {
          *(undefined8 *)(in_RCX + local_100 * 8) =
               *(undefined8 *)(in_R8 + (long)*(short *)(in_RSI + local_100 * 2) * 8);
        }
        break;
      case 2:
        for (local_108 = 0; local_108 < in_R9; local_108 = local_108 + 1) {
          *(undefined8 *)(in_RCX + local_108 * 8) =
               *(undefined8 *)(in_R8 + (long)*(int *)(in_RSI + local_108 * 4) * 8);
        }
        break;
      case 3:
        for (local_110 = 0; local_110 < in_R9; local_110 = local_110 + 1) {
          *(undefined8 *)(in_RCX + local_110 * 8) =
               *(undefined8 *)(in_R8 + *(long *)(in_RSI + local_110 * 8) * 8);
        }
        break;
      case 4:
        for (local_118 = 0; local_118 < in_R9; local_118 = local_118 + 1) {
          *(undefined8 *)(in_RCX + local_118 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_118) * 8);
        }
        break;
      case 5:
        for (local_120 = 0; local_120 < in_R9; local_120 = local_120 + 1) {
          *(undefined8 *)(in_RCX + local_120 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_120 * 2) * 8);
        }
        break;
      case 6:
        for (local_128 = 0; local_128 < in_R9; local_128 = local_128 + 1) {
          *(undefined8 *)(in_RCX + local_128 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_128 * 4) * 8);
        }
        break;
      case 7:
        for (local_130 = 0; local_130 < in_R9; local_130 = local_130 + 1) {
          *(undefined8 *)(in_RCX + local_130 * 8) =
               *(undefined8 *)(in_R8 + *(long *)(in_RSI + local_130 * 8) * 8);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 4:
      switch(in_EDI) {
      case 0:
        for (local_138 = 0; local_138 < in_R9; local_138 = local_138 + 1) {
          *(undefined1 *)(in_RCX + local_138) =
               *(undefined1 *)(in_R8 + *(char *)(in_RSI + local_138));
        }
        break;
      case 1:
        for (local_140 = 0; local_140 < in_R9; local_140 = local_140 + 1) {
          *(undefined1 *)(in_RCX + local_140) =
               *(undefined1 *)(in_R8 + *(short *)(in_RSI + local_140 * 2));
        }
        break;
      case 2:
        for (local_148 = 0; local_148 < in_R9; local_148 = local_148 + 1) {
          *(undefined1 *)(in_RCX + local_148) =
               *(undefined1 *)(in_R8 + *(int *)(in_RSI + local_148 * 4));
        }
        break;
      case 3:
        for (local_150 = 0; local_150 < in_R9; local_150 = local_150 + 1) {
          *(undefined1 *)(in_RCX + local_150) =
               *(undefined1 *)(in_R8 + *(long *)(in_RSI + local_150 * 8));
        }
        break;
      case 4:
        for (local_158 = 0; local_158 < in_R9; local_158 = local_158 + 1) {
          *(undefined1 *)(in_RCX + local_158) =
               *(undefined1 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_158));
        }
        break;
      case 5:
        for (local_160 = 0; local_160 < in_R9; local_160 = local_160 + 1) {
          *(undefined1 *)(in_RCX + local_160) =
               *(undefined1 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_160 * 2));
        }
        break;
      case 6:
        for (local_168 = 0; local_168 < in_R9; local_168 = local_168 + 1) {
          *(undefined1 *)(in_RCX + local_168) =
               *(undefined1 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_168 * 4));
        }
        break;
      case 7:
        for (local_170 = 0; local_170 < in_R9; local_170 = local_170 + 1) {
          *(undefined1 *)(in_RCX + local_170) =
               *(undefined1 *)(in_R8 + *(long *)(in_RSI + local_170 * 8));
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 5:
      switch(in_EDI) {
      case 0:
        for (local_178 = 0; local_178 < in_R9; local_178 = local_178 + 1) {
          *(undefined2 *)(in_RCX + local_178 * 2) =
               *(undefined2 *)(in_R8 + (long)*(char *)(in_RSI + local_178) * 2);
        }
        break;
      case 1:
        for (local_180 = 0; local_180 < in_R9; local_180 = local_180 + 1) {
          *(undefined2 *)(in_RCX + local_180 * 2) =
               *(undefined2 *)(in_R8 + (long)*(short *)(in_RSI + local_180 * 2) * 2);
        }
        break;
      case 2:
        for (local_188 = 0; local_188 < in_R9; local_188 = local_188 + 1) {
          *(undefined2 *)(in_RCX + local_188 * 2) =
               *(undefined2 *)(in_R8 + (long)*(int *)(in_RSI + local_188 * 4) * 2);
        }
        break;
      case 3:
        for (local_190 = 0; local_190 < in_R9; local_190 = local_190 + 1) {
          *(undefined2 *)(in_RCX + local_190 * 2) =
               *(undefined2 *)(in_R8 + *(long *)(in_RSI + local_190 * 8) * 2);
        }
        break;
      case 4:
        for (local_198 = 0; local_198 < in_R9; local_198 = local_198 + 1) {
          *(undefined2 *)(in_RCX + local_198 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_198) * 2);
        }
        break;
      case 5:
        for (local_1a0 = 0; local_1a0 < in_R9; local_1a0 = local_1a0 + 1) {
          *(undefined2 *)(in_RCX + local_1a0 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_1a0 * 2) * 2);
        }
        break;
      case 6:
        for (local_1a8 = 0; local_1a8 < in_R9; local_1a8 = local_1a8 + 1) {
          *(undefined2 *)(in_RCX + local_1a8 * 2) =
               *(undefined2 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_1a8 * 4) * 2);
        }
        break;
      case 7:
        for (local_1b0 = 0; local_1b0 < in_R9; local_1b0 = local_1b0 + 1) {
          *(undefined2 *)(in_RCX + local_1b0 * 2) =
               *(undefined2 *)(in_R8 + *(long *)(in_RSI + local_1b0 * 8) * 2);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 6:
      switch(in_EDI) {
      case 0:
        for (local_1b8 = 0; local_1b8 < in_R9; local_1b8 = local_1b8 + 1) {
          *(undefined4 *)(in_RCX + local_1b8 * 4) =
               *(undefined4 *)(in_R8 + (long)*(char *)(in_RSI + local_1b8) * 4);
        }
        break;
      case 1:
        for (local_1c0 = 0; local_1c0 < in_R9; local_1c0 = local_1c0 + 1) {
          *(undefined4 *)(in_RCX + local_1c0 * 4) =
               *(undefined4 *)(in_R8 + (long)*(short *)(in_RSI + local_1c0 * 2) * 4);
        }
        break;
      case 2:
        for (local_1c8 = 0; local_1c8 < in_R9; local_1c8 = local_1c8 + 1) {
          *(undefined4 *)(in_RCX + local_1c8 * 4) =
               *(undefined4 *)(in_R8 + (long)*(int *)(in_RSI + local_1c8 * 4) * 4);
        }
        break;
      case 3:
        for (local_1d0 = 0; local_1d0 < in_R9; local_1d0 = local_1d0 + 1) {
          *(undefined4 *)(in_RCX + local_1d0 * 4) =
               *(undefined4 *)(in_R8 + *(long *)(in_RSI + local_1d0 * 8) * 4);
        }
        break;
      case 4:
        for (local_1d8 = 0; local_1d8 < in_R9; local_1d8 = local_1d8 + 1) {
          *(undefined4 *)(in_RCX + local_1d8 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_1d8) * 4);
        }
        break;
      case 5:
        for (local_1e0 = 0; local_1e0 < in_R9; local_1e0 = local_1e0 + 1) {
          *(undefined4 *)(in_RCX + local_1e0 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_1e0 * 2) * 4);
        }
        break;
      case 6:
        for (local_1e8 = 0; local_1e8 < in_R9; local_1e8 = local_1e8 + 1) {
          *(undefined4 *)(in_RCX + local_1e8 * 4) =
               *(undefined4 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_1e8 * 4) * 4);
        }
        break;
      case 7:
        for (local_1f0 = 0; local_1f0 < in_R9; local_1f0 = local_1f0 + 1) {
          *(undefined4 *)(in_RCX + local_1f0 * 4) =
               *(undefined4 *)(in_R8 + *(long *)(in_RSI + local_1f0 * 8) * 4);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    case 7:
      switch(in_EDI) {
      case 0:
        for (local_1f8 = 0; local_1f8 < in_R9; local_1f8 = local_1f8 + 1) {
          *(undefined8 *)(in_RCX + local_1f8 * 8) =
               *(undefined8 *)(in_R8 + (long)*(char *)(in_RSI + local_1f8) * 8);
        }
        break;
      case 1:
        for (local_200 = 0; local_200 < in_R9; local_200 = local_200 + 1) {
          *(undefined8 *)(in_RCX + local_200 * 8) =
               *(undefined8 *)(in_R8 + (long)*(short *)(in_RSI + local_200 * 2) * 8);
        }
        break;
      case 2:
        for (local_208 = 0; local_208 < in_R9; local_208 = local_208 + 1) {
          *(undefined8 *)(in_RCX + local_208 * 8) =
               *(undefined8 *)(in_R8 + (long)*(int *)(in_RSI + local_208 * 4) * 8);
        }
        break;
      case 3:
        for (local_210 = 0; local_210 < in_R9; local_210 = local_210 + 1) {
          *(undefined8 *)(in_RCX + local_210 * 8) =
               *(undefined8 *)(in_R8 + *(long *)(in_RSI + local_210 * 8) * 8);
        }
        break;
      case 4:
        for (local_218 = 0; local_218 < in_R9; local_218 = local_218 + 1) {
          *(undefined8 *)(in_RCX + local_218 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(byte *)(in_RSI + local_218) * 8);
        }
        break;
      case 5:
        for (local_220 = 0; local_220 < in_R9; local_220 = local_220 + 1) {
          *(undefined8 *)(in_RCX + local_220 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(ushort *)(in_RSI + local_220 * 2) * 8);
        }
        break;
      case 6:
        for (local_228 = 0; local_228 < in_R9; local_228 = local_228 + 1) {
          *(undefined8 *)(in_RCX + local_228 * 8) =
               *(undefined8 *)(in_R8 + (ulong)*(uint *)(in_RSI + local_228 * 4) * 8);
        }
        break;
      case 7:
        for (local_230 = 0; local_230 < in_R9; local_230 = local_230 + 1) {
          *(undefined8 *)(in_RCX + local_230 * 8) =
               *(undefined8 *)(in_R8 + *(long *)(in_RSI + local_230 * 8) * 8);
        }
        break;
      default:
        FmsAbortNotImplemented();
      }
      break;
    default:
      FmsAbortNotImplemented();
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int FmsIntMapCopy(FmsIntType src_type, const void *src,
                         FmsIntType dst_type, void *dst, const void *map,
                         FmsInt size) {
  if (src_type >= FMS_NUM_INT_TYPES || dst_type >= FMS_NUM_INT_TYPES) {
    E_RETURN(1);
  }
  switch (dst_type) {
  case FMS_INT8:   FMS_IMC_SW(src_type,src,  int8_t,dst,map,size);
  case FMS_INT16:  FMS_IMC_SW(src_type,src, int16_t,dst,map,size);
  case FMS_INT32:  FMS_IMC_SW(src_type,src, int32_t,dst,map,size);
  case FMS_INT64:  FMS_IMC_SW(src_type,src, int64_t,dst,map,size);
  case FMS_UINT8:  FMS_IMC_SW(src_type,src, uint8_t,dst,map,size);
  case FMS_UINT16: FMS_IMC_SW(src_type,src,uint16_t,dst,map,size);
  case FMS_UINT32: FMS_IMC_SW(src_type,src,uint32_t,dst,map,size);
  case FMS_UINT64: FMS_IMC_SW(src_type,src,uint64_t,dst,map,size);
  default: FmsAbortNotImplemented();
  }
  return 0;
}